

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_storage_class.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::FixStorageClass::PropagateType
          (FixStorageClass *this,Instruction *inst,uint32_t type_id,uint32_t op_idx,
          set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *seen)

{
  Op OVar1;
  IRContext *pIVar2;
  _func_int *p_Var3;
  bool bVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  Instruction *pIVar8;
  Instruction *ptrInst;
  Type *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  *__range3;
  uint uVar10;
  pair<spvtools::opt::Instruction_*,_unsigned_int> *use;
  _func_int *p_Var11;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar12;
  pair<std::_Rb_tree_iterator<unsigned_int>,_std::_Rb_tree_iterator<unsigned_int>_> pVar13;
  vector<std::pair<spvtools::opt::Instruction_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::Instruction_*,_unsigned_int>_>_>
  uses;
  _func_int *local_78;
  _func_int *p_Stack_70;
  long local_68;
  Instruction *local_60;
  _Any_data local_58;
  PodType local_48;
  array<signed_char,_4UL> aStack_44;
  code **local_40;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  if (type_id == 0) {
    __assert_fail("type_id != 0 && \"Not given a valid type in PropagateType\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/fix_storage_class.cpp"
                  ,0xb4,
                  "bool spvtools::opt::FixStorageClass::PropagateType(Instruction *, uint32_t, uint32_t, std::set<uint32_t> *)"
                 );
  }
  OVar1 = inst->opcode_;
  bVar4 = false;
  if ((int)OVar1 < 0x53) {
    switch(OVar1) {
    case OpLoad:
      pIVar2 = (this->super_Pass).context_;
      if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar2);
      }
      pIVar8 = analysis::DefUseManager::GetDef
                         ((pIVar2->def_use_mgr_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                          _M_head_impl,type_id);
      uVar10 = (pIVar8->has_result_id_ & 1) + 1;
      if (pIVar8->has_type_id_ == false) {
        uVar10 = (uint)pIVar8->has_result_id_;
      }
      type_id = Instruction::GetSingleWordOperand(pIVar8,uVar10 + 1);
LAB_00204c7c:
      if (type_id != 0) goto LAB_00204e3e;
      break;
    case OpStore:
      uVar10 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar10 = (uint)inst->has_result_id_;
      }
      uVar5 = Instruction::GetSingleWordOperand(inst,uVar10 + 1);
      pIVar2 = (this->super_Pass).context_;
      if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar2);
      }
      pIVar8 = analysis::DefUseManager::GetDef
                         ((pIVar2->def_use_mgr_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                          _M_head_impl,uVar5);
      uVar5 = 0;
      if (pIVar8->has_type_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(pIVar8,0);
      }
      uVar6 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar6 = (uint)inst->has_result_id_;
      }
      uVar6 = Instruction::GetSingleWordOperand(inst,uVar6);
      pIVar2 = (this->super_Pass).context_;
      if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar2);
      }
      ptrInst = analysis::DefUseManager::GetDef
                          ((pIVar2->def_use_mgr_)._M_t.
                           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                           _M_head_impl,uVar6);
      uVar6 = Pass::GetPointeeTypeId(&this->super_Pass,ptrInst);
      if (uVar5 != uVar6) {
        pIVar2 = (this->super_Pass).context_;
        if ((pIVar2->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
          IRContext::BuildTypeManager(pIVar2);
        }
        pTVar9 = analysis::TypeManager::GetType
                           ((pIVar2->type_mgr_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                            _M_head_impl,uVar5);
        iVar7 = (*pTVar9->_vptr_Type[0x11])(pTVar9);
        if (CONCAT44(extraout_var,iVar7) != 0) {
          pIVar2 = (this->super_Pass).context_;
          if ((pIVar2->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
            IRContext::BuildTypeManager(pIVar2);
          }
          pTVar9 = analysis::TypeManager::GetType
                             ((pIVar2->type_mgr_)._M_t.
                              super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
                              .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>.
                              _M_head_impl,uVar6);
          iVar7 = (*pTVar9->_vptr_Type[0x11])(pTVar9);
          if (CONCAT44(extraout_var_00,iVar7) != 0) break;
        }
        local_48.data._M_elems =
             (array<signed_char,_4UL>)Pass::GenerateCopy(&this->super_Pass,pIVar8,uVar6,inst);
        if (local_48.data._M_elems != (_Type)0x0) {
          local_40 = (code **)&local_48;
          local_58._M_unused._M_object = &PTR__SmallVector_003d7c78;
          local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
          local_58._8_8_ = 1;
          Instruction::SetInOperand(inst,1,(OperandData *)&local_58);
          local_58._M_unused._M_object = &PTR__SmallVector_003d7c78;
          if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
            operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                       &local_38,local_38._M_head_impl);
          }
          pIVar2 = (this->super_Pass).context_;
          if ((pIVar2->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
            analysis::DefUseManager::UpdateDefUse
                      ((pIVar2->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,inst);
          }
        }
      }
      break;
    default:
      goto switchD_00204bd0_caseD_3f;
    case OpAccessChain:
    case OpInBoundsAccessChain:
    case OpPtrAccessChain:
    case OpInBoundsPtrAccessChain:
      if (op_idx == 2) {
        type_id = WalkAccessChainType(this,inst,type_id);
        goto LAB_00204c7c;
      }
    }
LAB_00204ef4:
    bVar4 = false;
  }
  else {
    if (OVar1 != OpCopyObject) {
      if (OVar1 == OpSelect) {
        if (2 < op_idx) goto LAB_00204e3e;
      }
      else {
        if (OVar1 != OpPhi) {
          return false;
        }
        uVar5 = 0;
        if (inst->has_result_id_ == true) {
          uVar5 = Instruction::GetSingleWordOperand(inst,(uint)inst->has_type_id_);
        }
        local_58._0_4_ = uVar5;
        pVar12 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::_M_insert_unique<unsigned_int>(&seen->_M_t,(uint *)local_58._M_pod_data);
        if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_00204e3e;
      }
      goto LAB_00204ef4;
    }
LAB_00204e3e:
    bVar4 = ChangeResultType(this,inst,type_id);
    local_78 = (_func_int *)0x0;
    p_Stack_70 = (_func_int *)0x0;
    local_68 = 0;
    pIVar2 = (this->super_Pass).context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    local_58._8_8_ = 0;
    local_40 = (code **)std::
                        _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/fix_storage_class.cpp:280:35)>
                        ::_M_invoke;
    _local_48 = std::
                _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/fix_storage_class.cpp:280:35)>
                ::_M_manager;
    local_60 = inst;
    local_58._M_unused._M_object = &local_78;
    analysis::DefUseManager::ForEachUse
              ((pIVar2->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               inst,(function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_58);
    p_Var11 = local_78;
    p_Var3 = p_Stack_70;
    if ((PodType  [2])_local_48 != (PodType  [2])0x0) {
      (*_local_48)(&local_58,&local_58,3);
      p_Var11 = local_78;
      p_Var3 = p_Stack_70;
    }
    for (; p_Var11 != p_Var3; p_Var11 = p_Var11 + 0x10) {
      PropagateType(this,*(Instruction **)p_Var11,type_id,*(uint32_t *)(p_Var11 + 8),seen);
    }
    if (local_60->opcode_ == OpPhi) {
      uVar5 = 0;
      if (local_60->has_result_id_ == true) {
        uVar5 = Instruction::GetSingleWordOperand(local_60,(uint)local_60->has_type_id_);
      }
      local_58._0_4_ = uVar5;
      pVar13 = std::
               _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               ::equal_range(&seen->_M_t,(key_type_conflict *)local_58._M_pod_data);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase_aux(&seen->_M_t,(_Base_ptr)pVar13.first._M_node,(_Base_ptr)pVar13.second._M_node);
    }
    if (local_78 != (_func_int *)0x0) {
      operator_delete(local_78,local_68 - (long)local_78);
    }
  }
switchD_00204bd0_caseD_3f:
  return bVar4;
}

Assistant:

bool FixStorageClass::PropagateType(Instruction* inst, uint32_t type_id,
                                    uint32_t op_idx, std::set<uint32_t>* seen) {
  assert(type_id != 0 && "Not given a valid type in PropagateType");
  bool modified = false;

  // If the type of operand |op_idx| forces the result type of |inst| to a
  // particular type, then we want find that type.
  uint32_t new_type_id = 0;
  switch (inst->opcode()) {
    case spv::Op::OpAccessChain:
    case spv::Op::OpPtrAccessChain:
    case spv::Op::OpInBoundsAccessChain:
    case spv::Op::OpInBoundsPtrAccessChain:
      if (op_idx == 2) {
        new_type_id = WalkAccessChainType(inst, type_id);
      }
      break;
    case spv::Op::OpCopyObject:
      new_type_id = type_id;
      break;
    case spv::Op::OpPhi:
      if (seen->insert(inst->result_id()).second) {
        new_type_id = type_id;
      }
      break;
    case spv::Op::OpSelect:
      if (op_idx > 2) {
        new_type_id = type_id;
      }
      break;
    case spv::Op::OpFunctionCall:
      // We cannot be sure of the actual connection between the type
      // of the parameter and the type of the result, so we should not
      // do anything.  If the result type needs to be fixed, the function call
      // should be inlined.
      return false;
    case spv::Op::OpLoad: {
      Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
      new_type_id = type_inst->GetSingleWordInOperand(1);
      break;
    }
    case spv::Op::OpStore: {
      uint32_t obj_id = inst->GetSingleWordInOperand(1);
      Instruction* obj_inst = get_def_use_mgr()->GetDef(obj_id);
      uint32_t obj_type_id = obj_inst->type_id();

      uint32_t ptr_id = inst->GetSingleWordInOperand(0);
      Instruction* ptr_inst = get_def_use_mgr()->GetDef(ptr_id);
      uint32_t pointee_type_id = GetPointeeTypeId(ptr_inst);

      if (obj_type_id != pointee_type_id) {
        if (context()->get_type_mgr()->GetType(obj_type_id)->AsImage() &&
            context()->get_type_mgr()->GetType(pointee_type_id)->AsImage()) {
          // When storing an image, allow the type mismatch
          // and let the later legalization passes eliminate the OpStore.
          // This is to support assigning an image to a variable,
          // where the assigned image does not have a pre-defined
          // image format.
          return false;
        }

        uint32_t copy_id = GenerateCopy(obj_inst, pointee_type_id, inst);
        if (copy_id == 0) {
          return false;
        }
        inst->SetInOperand(1, {copy_id});
        context()->UpdateDefUse(inst);
      }
    } break;
    case spv::Op::OpCopyMemory:
    case spv::Op::OpCopyMemorySized:
      // TODO: May need to expand the copy as we do with the stores.
      break;
    case spv::Op::OpCompositeConstruct:
    case spv::Op::OpCompositeExtract:
    case spv::Op::OpCompositeInsert:
      // TODO: DXC does not seem to generate code that will require changes to
      // these opcode.  The can be implemented when they come up.
      break;
    case spv::Op::OpImageTexelPointer:
    case spv::Op::OpBitcast:
      // Nothing to change for these opcode.  The result type is the same
      // regardless of the type of the operand.
      return false;
    default:
      // I expect the remaining instructions to act on types that are guaranteed
      // to be unique, so no change will be necessary.
      break;
  }

  // If the operand forces the result type, then make sure the result type
  // matches, and update the uses of |inst|.  We do not have to check the uses
  // of |inst| in the result type is not forced because we are only looking for
  // issue that come from mismatches between function formal and actual
  // parameters after the function has been inlined.  These parameters are
  // pointers. Once the type no longer depends on the type of the parameter,
  // then the types should have be correct.
  if (new_type_id != 0) {
    modified = ChangeResultType(inst, new_type_id);

    std::vector<std::pair<Instruction*, uint32_t>> uses;
    get_def_use_mgr()->ForEachUse(inst,
                                  [&uses](Instruction* use, uint32_t idx) {
                                    uses.push_back({use, idx});
                                  });

    for (auto& use : uses) {
      PropagateType(use.first, new_type_id, use.second, seen);
    }

    if (inst->opcode() == spv::Op::OpPhi) {
      seen->erase(inst->result_id());
    }
  }
  return modified;
}